

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O3

int N_VWrmsNormVectorArray(int nvec,N_Vector *X,N_Vector *W,realtype *nrm)

{
  _func_int_int_N_Vector_ptr_N_Vector_ptr_realtype_ptr *UNRECOVERED_JUMPTABLE;
  int iVar1;
  ulong uVar2;
  realtype rVar3;
  
  UNRECOVERED_JUMPTABLE = (*X)->ops->nvwrmsnormvectorarray;
  if (UNRECOVERED_JUMPTABLE != (_func_int_int_N_Vector_ptr_N_Vector_ptr_realtype_ptr *)0x0) {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(nvec,X,W,nrm);
    return iVar1;
  }
  if (0 < nvec) {
    uVar2 = 0;
    do {
      rVar3 = (*(*X)->ops->nvwrmsnorm)(X[uVar2],W[uVar2]);
      nrm[uVar2] = rVar3;
      uVar2 = uVar2 + 1;
    } while ((uint)nvec != uVar2);
  }
  return 0;
}

Assistant:

int N_VWrmsNormVectorArray(int nvec, N_Vector* X, N_Vector* W, realtype* nrm)
{
  int i, ier;

  if (X[0]->ops->nvwrmsnormvectorarray != NULL) {
    
    ier = X[0]->ops->nvwrmsnormvectorarray(nvec, X, W, nrm);
    return(ier);

  } else {

    for (i=0; i<nvec; i++) {
      nrm[i] = X[0]->ops->nvwrmsnorm(X[i], W[i]);
    }
    return(0);

  }
}